

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall ncnn::LSTM::load_model(LSTM *this,ModelBin *mb)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  long *in_RSI;
  long in_RDI;
  bool bVar4;
  int size;
  int num_directions;
  void *local_370;
  int *local_368;
  long *local_350;
  void *local_328;
  int *local_320;
  undefined8 local_318;
  undefined4 local_310;
  long *local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined8 local_2e8;
  void *local_2e0;
  int *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  void *local_288;
  int *local_280;
  undefined8 local_278;
  undefined4 local_270;
  long *local_268;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined8 local_248;
  undefined4 local_240;
  int local_23c;
  long *local_238;
  int local_224;
  void **local_220;
  void **local_210;
  void **local_200;
  void **local_1f0;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  void **local_1d0;
  void **local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  void **local_1b0;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  void **local_190;
  void **local_188;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  void **local_170;
  void **local_168;
  long *local_158;
  long *local_150;
  long *local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  
  local_23c = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_23c = 2;
  }
  uVar2 = (long)*(int *)(in_RDI + 0xd4) / (long)local_23c;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)*(int *)(in_RDI + 0xdc);
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 4;
  local_240 = (undefined4)uVar2;
  local_238 = in_RSI;
  (**(code **)(*in_RSI + 0x20))
            (&local_288,in_RSI,uVar2 & 0xffffffff,*(int *)(in_RDI + 0xdc) << 2,local_23c,0);
  ppvVar3 = (void **)(in_RDI + 0x128);
  local_178 = &local_288;
  local_170 = ppvVar3;
  if (ppvVar3 != local_178) {
    if (local_280 != (int *)0x0) {
      local_17c = 1;
      LOCK();
      local_180 = *local_280;
      *local_280 = *local_280 + 1;
      UNLOCK();
    }
    local_138 = ppvVar3;
    if (*(long *)(in_RDI + 0x130) != 0) {
      piVar1 = *(int **)(in_RDI + 0x130);
      local_13c = 0xffffffff;
      LOCK();
      local_140 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_140 == 1) {
        if (*(long *)(in_RDI + 0x148) == 0) {
          local_28 = *ppvVar3;
          if (local_28 != (void *)0x0) {
            free(local_28);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))(*(long **)(in_RDI + 0x148),*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *(undefined4 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined4 *)(in_RDI + 0x154) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined8 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *ppvVar3 = *local_178;
    *(void **)(in_RDI + 0x130) = local_178[1];
    *(void **)(in_RDI + 0x138) = local_178[2];
    *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_178 + 3);
    *(void **)(in_RDI + 0x148) = local_178[4];
    *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_178 + 5);
    *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_178 + 0x2c);
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_178 + 6);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_178 + 0x34);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_178 + 7);
    *(void **)(in_RDI + 0x168) = local_178[8];
  }
  local_220 = &local_288;
  local_168 = ppvVar3;
  local_88 = local_220;
  if (local_280 != (int *)0x0) {
    local_8c = 0xffffffff;
    LOCK();
    local_90 = *local_280;
    *local_280 = *local_280 + -1;
    UNLOCK();
    if (local_90 == 1) {
      if (local_268 == (long *)0x0) {
        if (local_288 != (void *)0x0) {
          free(local_288);
        }
      }
      else {
        (**(code **)(*local_268 + 0x18))(local_268,local_288);
      }
    }
  }
  local_288 = (void *)0x0;
  local_278 = 0;
  local_270 = 0;
  local_260 = 0;
  local_25c = 0;
  local_258 = 0;
  local_254 = 0;
  local_250 = 0;
  local_248 = 0;
  local_280 = (int *)0x0;
  local_148 = (long *)(in_RDI + 0x128);
  bVar4 = true;
  if (*local_148 != 0) {
    bVar4 = *(long *)(in_RDI + 0x168) * (long)*(int *)(in_RDI + 0x160) == 0;
    local_20 = local_148;
  }
  if (bVar4) {
    local_224 = -100;
  }
  else {
    (**(code **)(*local_238 + 0x20))
              (&local_2e0,local_238,*(undefined4 *)(in_RDI + 0xdc),4,local_23c,0);
    ppvVar3 = (void **)(in_RDI + 0x170);
    local_198 = &local_2e0;
    local_190 = ppvVar3;
    if (ppvVar3 != local_198) {
      if (local_2d8 != (int *)0x0) {
        local_19c = 1;
        LOCK();
        local_1a0 = *local_2d8;
        *local_2d8 = *local_2d8 + 1;
        UNLOCK();
      }
      local_128 = ppvVar3;
      if (*(long *)(in_RDI + 0x178) != 0) {
        piVar1 = *(int **)(in_RDI + 0x178);
        local_12c = 0xffffffff;
        LOCK();
        local_130 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_130 == 1) {
          if (*(long *)(in_RDI + 400) == 0) {
            local_30 = *ppvVar3;
            if (local_30 != (void *)0x0) {
              free(local_30);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
      *(undefined4 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x1b0) = 0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *ppvVar3 = *local_198;
      *(void **)(in_RDI + 0x178) = local_198[1];
      *(void **)(in_RDI + 0x180) = local_198[2];
      *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_198 + 3);
      *(void **)(in_RDI + 400) = local_198[4];
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_198 + 5);
      *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_198 + 0x2c);
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_198 + 6);
      *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_198 + 0x34);
      *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_198 + 7);
      *(void **)(in_RDI + 0x1b0) = local_198[8];
    }
    local_210 = &local_2e0;
    local_188 = ppvVar3;
    local_a8 = local_210;
    if (local_2d8 != (int *)0x0) {
      local_ac = 0xffffffff;
      LOCK();
      local_b0 = *local_2d8;
      *local_2d8 = *local_2d8 + -1;
      UNLOCK();
      if (local_b0 == 1) {
        if (local_2c0 == (long *)0x0) {
          if (local_2e0 != (void *)0x0) {
            free(local_2e0);
          }
        }
        else {
          (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0);
        }
      }
    }
    local_2e0 = (void *)0x0;
    local_2d0 = 0;
    local_2c8 = 0;
    local_2b8 = 0;
    local_2b4 = 0;
    local_2b0 = 0;
    local_2ac = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_2d8 = (int *)0x0;
    local_150 = (long *)(in_RDI + 0x170);
    bVar4 = true;
    if (*local_150 != 0) {
      bVar4 = *(long *)(in_RDI + 0x1b0) * (long)*(int *)(in_RDI + 0x1a8) == 0;
      local_18 = local_150;
    }
    if (bVar4) {
      local_224 = -100;
    }
    else {
      (**(code **)(*local_238 + 0x20))
                (&local_328,local_238,*(undefined4 *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xdc) << 2,
                 local_23c,0);
      ppvVar3 = (void **)(in_RDI + 0xe0);
      local_1b8 = &local_328;
      local_1b0 = ppvVar3;
      if (ppvVar3 != local_1b8) {
        if (local_320 != (int *)0x0) {
          local_1bc = 1;
          LOCK();
          local_1c0 = *local_320;
          *local_320 = *local_320 + 1;
          UNLOCK();
        }
        local_118 = ppvVar3;
        if (*(long *)(in_RDI + 0xe8) != 0) {
          piVar1 = *(int **)(in_RDI + 0xe8);
          local_11c = 0xffffffff;
          LOCK();
          local_120 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_120 == 1) {
            if (*(long *)(in_RDI + 0x100) == 0) {
              local_38 = *ppvVar3;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),*ppvVar3)
              ;
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0xf0) = 0;
        *(undefined4 *)(in_RDI + 0xf8) = 0;
        *(undefined4 *)(in_RDI + 0x108) = 0;
        *(undefined4 *)(in_RDI + 0x10c) = 0;
        *(undefined4 *)(in_RDI + 0x110) = 0;
        *(undefined4 *)(in_RDI + 0x114) = 0;
        *(undefined4 *)(in_RDI + 0x118) = 0;
        *(undefined8 *)(in_RDI + 0x120) = 0;
        *(undefined8 *)(in_RDI + 0xe8) = 0;
        *ppvVar3 = *local_1b8;
        *(void **)(in_RDI + 0xe8) = local_1b8[1];
        *(void **)(in_RDI + 0xf0) = local_1b8[2];
        *(undefined4 *)(in_RDI + 0xf8) = *(undefined4 *)(local_1b8 + 3);
        *(void **)(in_RDI + 0x100) = local_1b8[4];
        *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_1b8 + 5);
        *(undefined4 *)(in_RDI + 0x10c) = *(undefined4 *)((long)local_1b8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_1b8 + 6);
        *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_1b8 + 0x34);
        *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_1b8 + 7);
        *(void **)(in_RDI + 0x120) = local_1b8[8];
      }
      local_200 = &local_328;
      local_1a8 = ppvVar3;
      local_c8 = local_200;
      if (local_320 != (int *)0x0) {
        local_cc = 0xffffffff;
        LOCK();
        local_d0 = *local_320;
        *local_320 = *local_320 + -1;
        UNLOCK();
        if (local_d0 == 1) {
          if (local_308 == (long *)0x0) {
            if (local_328 != (void *)0x0) {
              free(local_328);
            }
          }
          else {
            (**(code **)(*local_308 + 0x18))(local_308,local_328);
          }
        }
      }
      local_328 = (void *)0x0;
      local_318 = 0;
      local_310 = 0;
      local_300 = 0;
      local_2fc = 0;
      local_2f8 = 0;
      local_2f4 = 0;
      local_2f0 = 0;
      local_2e8 = 0;
      local_320 = (int *)0x0;
      local_158 = (long *)(in_RDI + 0xe0);
      bVar4 = true;
      if (*local_158 != 0) {
        bVar4 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
        local_10 = local_158;
      }
      if (bVar4) {
        local_224 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) != *(int *)(in_RDI + 0xdc)) {
          (**(code **)(*local_238 + 0x20))
                    (&local_370,local_238,*(undefined4 *)(in_RDI + 0xdc),
                     *(undefined4 *)(in_RDI + 0xd0),local_23c,0);
          ppvVar3 = (void **)(in_RDI + 0x1b8);
          local_1d8 = &local_370;
          local_1d0 = ppvVar3;
          if (ppvVar3 != local_1d8) {
            if (local_368 != (int *)0x0) {
              local_1dc = 1;
              LOCK();
              local_1e0 = *local_368;
              *local_368 = *local_368 + 1;
              UNLOCK();
            }
            local_108 = ppvVar3;
            if (*(long *)(in_RDI + 0x1c0) != 0) {
              piVar1 = *(int **)(in_RDI + 0x1c0);
              local_10c = 0xffffffff;
              LOCK();
              local_110 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_110 == 1) {
                if (*(long *)(in_RDI + 0x1d8) == 0) {
                  local_40 = *ppvVar3;
                  if (local_40 != (void *)0x0) {
                    free(local_40);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x1d8) + 0x18))
                            (*(long **)(in_RDI + 0x1d8),*ppvVar3);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x1c8) = 0;
            *(undefined4 *)(in_RDI + 0x1d0) = 0;
            *(undefined4 *)(in_RDI + 0x1e0) = 0;
            *(undefined4 *)(in_RDI + 0x1e4) = 0;
            *(undefined4 *)(in_RDI + 0x1e8) = 0;
            *(undefined4 *)(in_RDI + 0x1ec) = 0;
            *(undefined4 *)(in_RDI + 0x1f0) = 0;
            *(undefined8 *)(in_RDI + 0x1f8) = 0;
            *(undefined8 *)(in_RDI + 0x1c0) = 0;
            *ppvVar3 = *local_1d8;
            *(void **)(in_RDI + 0x1c0) = local_1d8[1];
            *(void **)(in_RDI + 0x1c8) = local_1d8[2];
            *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_1d8 + 3);
            *(void **)(in_RDI + 0x1d8) = local_1d8[4];
            *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_1d8 + 5);
            *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_1d8 + 0x2c);
            *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_1d8 + 6);
            *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_1d8 + 0x34);
            *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_1d8 + 7);
            *(void **)(in_RDI + 0x1f8) = local_1d8[8];
          }
          local_1f0 = &local_370;
          if (local_368 != (int *)0x0) {
            local_ec = 0xffffffff;
            LOCK();
            local_f0 = *local_368;
            *local_368 = *local_368 + -1;
            UNLOCK();
            if (local_f0 == 1) {
              local_1c8 = ppvVar3;
              local_e8 = local_1f0;
              if (local_350 == (long *)0x0) {
                if (local_370 != (void *)0x0) {
                  free(local_370);
                }
              }
              else {
                (**(code **)(*local_350 + 0x18))(local_350,local_370);
              }
            }
          }
          bVar4 = true;
          if (*(long *)(in_RDI + 0x1b8) != 0) {
            bVar4 = *(long *)(in_RDI + 0x1f8) * (long)*(int *)(in_RDI + 0x1f0) == 0;
          }
          if (bVar4) {
            return -100;
          }
        }
        local_224 = 0;
      }
    }
  }
  return local_224;
}

Assistant:

int LSTM::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / hidden_size / 4;

    // raw weight data
    weight_xc_data = mb.load(size, hidden_size * 4, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(hidden_size, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, hidden_size * 4, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    if (num_output != hidden_size)
    {
        weight_hr_data = mb.load(hidden_size, num_output, num_directions, 0);
        if (weight_hr_data.empty())
            return -100;
    }

    return 0;
}